

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O2

string * cmTrimWhitespace_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  sVar2 = str._M_len;
  pcVar3 = str._M_str;
  while( true ) {
    if (sVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    bVar1 = cmIsSpace(*pcVar3);
    if (!bVar1) break;
    pcVar3 = pcVar3 + 1;
    sVar2 = sVar2 - 1;
  }
  pcVar4 = str._M_str + str._M_len + 1;
  do {
    bVar1 = cmIsSpace(pcVar4[-2]);
    pcVar4 = pcVar4 + -1;
  } while (bVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTrimWhitespace(cm::string_view str)
{
  // XXX(clang-tidy): This declaration and the next cannot be `const auto*`
  // because the qualification of `auto` is platform-dependent.
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto start = str.begin();
  while (start != str.end() && cmIsSpace(*start)) {
    ++start;
  }
  if (start == str.end()) {
    return std::string();
  }
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto stop = str.end() - 1;
  while (cmIsSpace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}